

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O1

void __thiscall
CStringKMerFactory128::create_kmers
          (CStringKMerFactory128 *this,
          vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers,char *s)

{
  __uint128_t *p_Var1;
  __uint128_t *p_Var2;
  int64_t *piVar3;
  byte bVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __uint128_t *__args;
  byte *pbVar11;
  iterator __position;
  ulong uVar12;
  bool bVar13;
  
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  bVar4 = *s;
  if (bVar4 != 0) {
    p_Var1 = &(this->super_KMerFactory128).fkmer;
    p_Var2 = &(this->super_KMerFactory128).rkmer;
    pbVar11 = (byte *)(s + 1);
    do {
      cVar5 = (this->super_KMerFactory128).b2f._M_elems[bVar4];
      if (cVar5 == '\x04') {
        (this->super_KMerFactory128).last_unknown = 0;
        uVar7 = (ulong)(this->super_KMerFactory128).rkmer;
        lVar6 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8);
        uVar8 = *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        *(ulong *)&(this->super_KMerFactory128).rkmer =
             uVar7 << 2 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) =
             (lVar6 << 2 | uVar7 >> 0x3e) & uVar8;
        uVar7 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        bVar4 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar10 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar7 << 0x3e;
        uVar12 = 3L << (bVar4 & 0x3f);
        uVar9 = uVar12;
        uVar8 = 0L << (bVar4 & 0x3f) | 3UL >> 0x40 - (bVar4 & 0x3f);
        if ((bVar4 & 0x40) != 0) {
          uVar9 = 0;
          uVar8 = uVar12;
        }
        *(ulong *)&(this->super_KMerFactory128).fkmer = uVar9 + uVar10;
        *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) =
             uVar8 + (uVar7 >> 2) + (ulong)CARRY8(uVar9,uVar10);
      }
      else {
        uVar7 = (ulong)(this->super_KMerFactory128).rkmer;
        lVar6 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8);
        uVar10 = uVar7 * 4;
        uVar9 = (ulong)cVar5;
        uVar8 = *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        *(ulong *)&(this->super_KMerFactory128).rkmer =
             uVar10 + uVar9 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) =
             ((long)uVar9 >> 0x3f) + (lVar6 << 2 | uVar7 >> 0x3e) + (ulong)CARRY8(uVar10,uVar9) &
             uVar8;
        uVar7 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar10 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar7 << 0x3e;
        uVar8 = (ulong)(this->super_KMerFactory128).b2r._M_elems[bVar4];
        bVar4 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar9 = uVar8 << (bVar4 & 0x3f);
        bVar13 = (bVar4 & 0x40) != 0;
        uVar8 = ((long)uVar8 >> 0x3f) << (bVar4 & 0x3f) | uVar8 >> 0x40 - (bVar4 & 0x3f);
        if (bVar13) {
          uVar8 = uVar9;
        }
        uVar12 = 0;
        if (!bVar13) {
          uVar12 = uVar9;
        }
        *(ulong *)&(this->super_KMerFactory128).fkmer = uVar12 + uVar10;
        *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) =
             uVar8 + (uVar7 >> 2) + (ulong)CARRY8(uVar12,uVar10);
        piVar3 = &(this->super_KMerFactory128).last_unknown;
        *piVar3 = *piVar3 + 1;
      }
      if ((long)(ulong)(this->super_KMerFactory128).K <= (this->super_KMerFactory128).last_unknown)
      {
        uVar7 = (ulong)*p_Var1;
        uVar8 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar9 = (ulong)*p_Var2;
        uVar10 = *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8);
        if (uVar10 < uVar8 || uVar10 - uVar8 < (ulong)(uVar9 < uVar7)) {
          __position._M_current =
               (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          __args = p_Var2;
          if (__position._M_current ==
              (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_001a1cd6:
            std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
            _M_realloc_insert<unsigned__int128&>
                      ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)mers,__position,
                       __args);
            goto LAB_001a1cdb;
          }
          *(ulong *)__position._M_current = uVar9;
          *(ulong *)((long)__position._M_current + 8) = uVar10;
        }
        else {
          __position._M_current =
               (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          __args = p_Var1;
          if (__position._M_current ==
              (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001a1cd6;
          *(ulong *)__position._M_current = uVar7;
          *(ulong *)((long)__position._M_current + 8) = uVar8;
        }
        (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_001a1cdb:
      bVar4 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    } while (bVar4 != 0);
  }
  return;
}

Assistant:

const void create_kmers(std::vector<__uint128_t> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer);
                }
            }
        }
    }